

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *fname;
  MOJOSHADER_error *pMVar1;
  MOJOSHADER_effectObject *pMVar2;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  uchar *buf;
  size_t sVar5;
  MOJOSHADER_effect *_effect;
  MOJOSHADER_parseData *pd;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  MOJOSHADER_effectParam *value;
  MOJOSHADER_effectPass *pMVar9;
  char *pcVar10;
  ulong uVar11;
  MOJOSHADER_effectState *pMVar12;
  int i;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int local_8c;
  MOJOSHADER_effectTechnique *local_70;
  
  puts("MojoShader testparse");
  printf("Compiled against changeset %s\n","???");
  pcVar4 = MOJOSHADER_changeset();
  printf("Linked against changeset %s\n",pcVar4);
  putchar(10);
  if (argc < 3) {
    local_8c = 0;
    printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n",*argv);
  }
  else {
    pcVar4 = argv[1];
    local_8c = 0;
    for (uVar8 = 2; uVar8 != (uint)argc; uVar8 = uVar8 + 1) {
      __stream = fopen(argv[uVar8],"rb");
      if (__stream == (FILE *)0x0) {
        printf(" ... fopen(\'%s\') failed.\n",argv[uVar8]);
      }
      else {
        buf = (uchar *)malloc(1000000);
        sVar5 = fread(buf,1,1000000,__stream);
        fclose(__stream);
        fname = argv[uVar8];
        if (*buf == 0xcf) {
          if (((buf[1] == '\v') && (buf[2] == 0xf0)) && (buf[3] == 0xbc)) goto LAB_00107475;
LAB_00107541:
          pd = MOJOSHADER_parse(pcVar4,(char *)0x0,buf,(uint)sVar5,(MOJOSHADER_swizzle *)0x0,0,
                                (MOJOSHADER_samplerMap *)0x0,0,(MOJOSHADER_malloc)0x0,
                                (MOJOSHADER_free)0x0,(void *)0x0);
          iVar13 = pd->error_count;
          printf("SHADER: %s\n",fname);
          print_shader(fname,pd,1);
          MOJOSHADER_freeParseData(pd);
        }
        else {
          if (((*buf != '\x01') || (buf[1] != '\t')) || ((buf[2] != 0xff || (buf[3] != 0xfe))))
          goto LAB_00107541;
LAB_00107475:
          _effect = MOJOSHADER_parseEffect
                              (pcVar4,buf,(uint)sVar5,(MOJOSHADER_swizzle *)0x0,0,
                               (MOJOSHADER_samplerMap *)0x0,0,(MOJOSHADER_malloc)0x0,
                               (MOJOSHADER_free)0x0,(void *)0x0);
          iVar13 = _effect->error_count;
          printf("EFFECT: %s\n",fname);
          do_indent(1);
          printf("PROFILE: %s\n",_effect->profile);
          putchar(10);
          iVar3 = _effect->error_count;
          if (iVar3 < 1) {
            value = _effect->params;
            local_70 = _effect->techniques;
            pMVar2 = _effect->objects;
            for (uVar14 = 0; (int)uVar14 < _effect->param_count; uVar14 = uVar14 + 1) {
              do_indent(1);
              printf("PARAM #%d\n",(ulong)uVar14);
              print_value(&value->value,2);
              if (value->annotation_count != 0) {
                do_indent(2);
                puts("ANNOTATIONS:");
              }
              lVar7 = 0;
              for (uVar11 = 0; uVar11 < value->annotation_count; uVar11 = uVar11 + 1) {
                print_value((MOJOSHADER_effectValue *)((long)&value->annotations->name + lVar7),3);
                lVar7 = lVar7 + 0x40;
              }
              value = value + 1;
            }
            putchar(10);
            for (uVar14 = 0; (int)uVar14 < _effect->technique_count; uVar14 = uVar14 + 1) {
              pMVar9 = local_70->passes;
              do_indent(1);
              printf("TECHNIQUE #%d (\'%s\'):\n",(ulong)uVar14,local_70->name);
              for (uVar15 = 0; uVar15 < local_70->pass_count; uVar15 = uVar15 + 1) {
                pMVar12 = pMVar9->states;
                do_indent(2);
                printf("PASS #%d (\'%s\'):\n",(ulong)uVar15,pMVar9->name);
                for (uVar17 = 0; uVar17 < pMVar9->state_count; uVar17 = uVar17 + 1) {
                  do_indent(3);
                  printf("STATE %d:\n",(ulong)pMVar12->type);
                  print_value(&pMVar12->value,4);
                  pMVar12 = pMVar12 + 1;
                }
                pMVar9 = pMVar9 + 1;
              }
              local_70 = local_70 + 1;
            }
            putchar(10);
            uVar11 = 1;
            while( true ) {
              if (_effect->object_count <= (int)uVar11) break;
              do_indent(1);
              switch(pMVar2[1].type) {
              case MOJOSHADER_SYMTYPE_STRING:
                uVar6 = *(undefined8 *)((long)pMVar2 + 0x50);
                pcVar10 = "OBJECT #%d: STRING, \'%s\'\n";
                break;
              case MOJOSHADER_SYMTYPE_TEXTURE:
              case MOJOSHADER_SYMTYPE_TEXTURE1D:
              case MOJOSHADER_SYMTYPE_TEXTURE2D:
              case MOJOSHADER_SYMTYPE_TEXTURE3D:
              case MOJOSHADER_SYMTYPE_TEXTURECUBE:
                pcVar10 = "OBJECT #%d: TEXTURE\n";
                goto LAB_00107798;
              case MOJOSHADER_SYMTYPE_SAMPLER:
              case MOJOSHADER_SYMTYPE_SAMPLER1D:
              case MOJOSHADER_SYMTYPE_SAMPLER2D:
              case MOJOSHADER_SYMTYPE_SAMPLER3D:
              case MOJOSHADER_SYMTYPE_SAMPLERCUBE:
                uVar6 = *(undefined8 *)((long)pMVar2 + 0x50);
                pcVar10 = "OBJECT #%d: MAPPING, \'%s\'\n";
                break;
              case MOJOSHADER_SYMTYPE_PIXELSHADER:
              case MOJOSHADER_SYMTYPE_VERTEXSHADER:
                if (*(int *)((long)pMVar2 + 0x54) == 0) {
                  printf("OBJECT #%d: SHADER, technique %u, pass %u\n",uVar11,
                         (ulong)*(uint *)((long)pMVar2 + 0x4c),(ulong)*(uint *)((long)pMVar2 + 0x50)
                        );
                  print_shader(fname,*(MOJOSHADER_parseData **)((long)pMVar2 + 0x88),2);
                }
                else {
                  printf("OBJECT #%d: PRESHADER, technique %u, pass %u, param %s\n",uVar11,
                         (ulong)*(uint *)((long)pMVar2 + 0x4c),(ulong)*(uint *)((long)pMVar2 + 0x50)
                        );
                  print_preshader(*(MOJOSHADER_preshader **)((long)pMVar2 + 0x88),2);
                }
                goto LAB_001077b7;
              default:
                pcVar10 = "UNKNOWN OBJECT: #%d\n";
LAB_00107798:
                printf(pcVar10,uVar11);
                goto LAB_001077b7;
              }
              printf(pcVar10,uVar11,uVar6);
LAB_001077b7:
              uVar11 = (ulong)((int)uVar11 + 1);
              pMVar2 = pMVar2 + 1;
            }
          }
          else {
            lVar7 = 0x10;
            for (lVar16 = 0; lVar16 < iVar3; lVar16 = lVar16 + 1) {
              pMVar1 = _effect->errors;
              do_indent(1);
              pcVar10 = *(char **)((long)pMVar1 + lVar7 + -8);
              if (pcVar10 == (char *)0x0) {
                pcVar10 = fname;
              }
              printf("%s:%d: ERROR: %s\n",pcVar10,(ulong)*(uint *)((long)&pMVar1->error + lVar7),
                     *(undefined8 *)((long)pMVar1 + lVar7 + -0x10));
              iVar3 = _effect->error_count;
              lVar7 = lVar7 + 0x18;
            }
          }
          MOJOSHADER_freeEffect(_effect);
        }
        if (iVar13 != 0) {
          local_8c = 1;
        }
        free(buf);
      }
    }
  }
  return local_8c;
}

Assistant:

int main(int argc, char **argv)
{
    int retval = 0;

    printf("MojoShader testparse\n");
    printf("Compiled against changeset %s\n", MOJOSHADER_CHANGESET);
    printf("Linked against changeset %s\n", MOJOSHADER_changeset());
    printf("\n");

    if (argc <= 2)
        printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n", argv[0]);
    else
    {
        const char *profile = argv[1];
        int i;

        for (i = 2; i < argc; i++)
        {
            FILE *io = fopen(argv[i], "rb");
            if (io == NULL)
                printf(" ... fopen('%s') failed.\n", argv[i]);
            else
            {
                unsigned char *buf = (unsigned char *) malloc(1000000);
                int rc = fread(buf, 1, 1000000, io);
                fclose(io);
                if (!do_parse(argv[i], buf, rc, profile))
                    retval = 1;
                free(buf);
            } // else
        } // for
    } // else

    return retval;
}